

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O2

dh_ctx * dh_setup_gex(mp_int *pval,mp_int *gval)

{
  dh_ctx *ctx;
  mp_int *pmVar1;
  
  ctx = (dh_ctx *)safemalloc(1,0x28,0);
  pmVar1 = mp_copy(pval);
  ctx->p = pmVar1;
  pmVar1 = mp_copy(gval);
  ctx->g = pmVar1;
  dh_init(ctx);
  return ctx;
}

Assistant:

dh_ctx *dh_setup_gex(mp_int *pval, mp_int *gval)
{
    dh_ctx *ctx = snew(dh_ctx);
    ctx->p = mp_copy(pval);
    ctx->g = mp_copy(gval);
    dh_init(ctx);
    return ctx;
}